

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha256.c
# Opt level: O2

void sha256_transform(SHA256_CTX *ctx,BYTE *data)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  int aiStack_178 [9];
  int local_154 [5];
  uint local_140 [68];
  
  for (lVar11 = 0; lVar11 != 0x10; lVar11 = lVar11 + 1) {
    uVar1 = *(uint *)(data + lVar11 * 4);
    local_140[lVar11 + 2] =
         uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  }
  for (lVar11 = 0x10; lVar11 != 0x40; lVar11 = lVar11 + 1) {
    uVar1 = local_140[lVar11];
    iVar18 = aiStack_178[lVar11 + 1];
    local_140[lVar11 + 2] =
         aiStack_178[lVar11] + local_154[lVar11] +
         ((int)uVar1 >> 10 ^ (uVar1 << 0xd | (int)uVar1 >> 0x13) ^
         (uVar1 << 0xf | (int)uVar1 >> 0x11)) +
         (iVar18 >> 3 ^ (iVar18 << 0xe | iVar18 >> 0x12) ^ (iVar18 << 0x19 | iVar18 >> 7));
  }
  uVar1 = ctx->state[1];
  uVar2 = ctx->state[2];
  uVar3 = ctx->state[3];
  uVar4 = ctx->state[4];
  uVar5 = ctx->state[5];
  uVar6 = ctx->state[6];
  uVar7 = ctx->state[7];
  uVar8 = ctx->state[0];
  uVar16 = uVar1;
  uVar13 = uVar2;
  uVar12 = uVar3;
  uVar10 = uVar4;
  uVar9 = uVar5;
  uVar19 = uVar6;
  uVar17 = uVar7;
  for (lVar11 = 0; uVar14 = uVar19, uVar19 = uVar9, uVar9 = uVar10, uVar15 = uVar13, uVar13 = uVar16
      , uVar16 = uVar8, lVar11 != 0x100; lVar11 = lVar11 + 4) {
    iVar18 = uVar17 + ((uVar19 ^ uVar14) & uVar9 ^ uVar14) +
             ((uVar9 << 7 | (int)uVar9 >> 0x19) ^
             (uVar9 << 0x15 | (int)uVar9 >> 0xb) ^ (uVar9 << 0x1a | (int)uVar9 >> 6)) +
             *(int *)((long)k + lVar11) + *(int *)((long)local_140 + lVar11 + 8);
    uVar10 = uVar12 + iVar18;
    uVar8 = (uVar13 & uVar15 ^ (uVar13 ^ uVar15) & uVar16) +
            ((uVar16 << 10 | (int)uVar16 >> 0x16) ^
            (uVar16 << 0x13 | (int)uVar16 >> 0xd) ^ (uVar16 << 0x1e | (int)uVar16 >> 2)) + iVar18;
    uVar12 = uVar15;
    uVar17 = uVar14;
  }
  ctx->state[0] = uVar16 + ctx->state[0];
  ctx->state[1] = uVar13 + uVar1;
  ctx->state[2] = uVar15 + uVar2;
  ctx->state[3] = uVar12 + uVar3;
  ctx->state[4] = uVar9 + uVar4;
  ctx->state[5] = uVar19 + uVar5;
  ctx->state[6] = uVar14 + uVar6;
  ctx->state[7] = uVar17 + uVar7;
  return;
}

Assistant:

static inline void sha256_transform(SHA256_CTX *ctx, const BYTE data[])
{
    WORD a, b, c, d, e, f, g, h, i, j, t1, t2, m[64];

    for (i = 0, j = 0; i < 16; ++i, j += 4)
        m[i] = (data[j] << 24) | (data[j + 1] << 16) | (data[j + 2] << 8) | (data[j + 3]);
    for ( ; i < 64; ++i)
        m[i] = SIG1(m[i - 2]) + m[i - 7] + SIG0(m[i - 15]) + m[i - 16];

    a = ctx->state[0];
    b = ctx->state[1];
    c = ctx->state[2];
    d = ctx->state[3];
    e = ctx->state[4];
    f = ctx->state[5];
    g = ctx->state[6];
    h = ctx->state[7];

    for (i = 0; i < 64; ++i) {
        t1 = h + EP1(e) + CH(e,f,g) + k[i] + m[i];
        t2 = EP0(a) + MAJ(a,b,c);
        h = g;
        g = f;
        f = e;
        e = d + t1;
        d = c;
        c = b;
        b = a;
        a = t1 + t2;
    }

    ctx->state[0] += a;
    ctx->state[1] += b;
    ctx->state[2] += c;
    ctx->state[3] += d;
    ctx->state[4] += e;
    ctx->state[5] += f;
    ctx->state[6] += g;
    ctx->state[7] += h;
}